

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ly_common.c
# Opt level: O3

LY_ERR lys_parse_id(char **id)

{
  byte bVar1;
  LY_ERR LVar2;
  byte *pbVar3;
  
  pbVar3 = (byte *)*id;
  if (pbVar3 == (byte *)0x0) {
    __assert_fail("id && *id",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/ly_common.c"
                  ,0x32b,"LY_ERR lys_parse_id(const char **)");
  }
  bVar1 = *pbVar3;
  if (((byte)(bVar1 + 0x9f) < 0x1a) ||
     (LVar2 = LY_EINVAL, bVar1 == 0x5f || (byte)(bVar1 + 0xbf) < 0x1a)) {
    do {
      do {
        pbVar3 = pbVar3 + 1;
        *id = (char *)pbVar3;
        bVar1 = *pbVar3;
      } while ((byte)(bVar1 - 0x30) < 10);
    } while (((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a) ||
            ((bVar1 - 0x2d < 0x33 && ((0x4000000000003U >> ((ulong)(bVar1 - 0x2d) & 0x3f) & 1) != 0)
             )));
    LVar2 = LY_SUCCESS;
  }
  return LVar2;
}

Assistant:

static LY_ERR
lys_parse_id(const char **id)
{
    assert(id && *id);

    if (!is_yangidentstartchar(**id)) {
        return LY_EINVAL;
    }
    ++(*id);

    while (is_yangidentchar(**id)) {
        ++(*id);
    }
    return LY_SUCCESS;
}